

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tsgGridGlobal.cpp
# Opt level: O3

void __thiscall
TasGrid::GridGlobal::evaluateHierarchicalFunctions(GridGlobal *this,double *x,int num_x,double *y)

{
  int iVar1;
  int iVar2;
  MultiIndexSet *pMVar3;
  ulong uVar4;
  
  pMVar3 = &(this->super_BaseCanonicalGrid).points;
  if ((this->super_BaseCanonicalGrid).points.indexes.super__Vector_base<int,_std::allocator<int>_>.
      _M_impl.super__Vector_impl_data._M_start ==
      (this->super_BaseCanonicalGrid).points.indexes.super__Vector_base<int,_std::allocator<int>_>.
      _M_impl.super__Vector_impl_data._M_finish) {
    pMVar3 = &(this->super_BaseCanonicalGrid).needed;
  }
  if (0 < num_x) {
    iVar1 = (this->super_BaseCanonicalGrid).num_dimensions;
    iVar2 = pMVar3->cache_num_indexes;
    uVar4 = (ulong)(uint)num_x;
    do {
      (*(this->super_BaseCanonicalGrid)._vptr_BaseCanonicalGrid[0xd])(this,x,y);
      y = y + iVar2;
      x = x + iVar1;
      uVar4 = uVar4 - 1;
    } while (uVar4 != 0);
  }
  return;
}

Assistant:

void GridGlobal::evaluateHierarchicalFunctions(const double x[], int num_x, double y[]) const{
    int num_points = (points.empty()) ? needed.getNumIndexes() : points.getNumIndexes();
    Utils::Wrapper2D<const double> xwrap(num_dimensions, x);
    Utils::Wrapper2D<double> ywrap(num_points, y);
    #pragma omp parallel for
    for(int i=0; i<num_x; i++)
        getInterpolationWeights(xwrap.getStrip(i), ywrap.getStrip(i));
}